

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsrtDebugManager.cpp
# Opt level: O0

void __thiscall
JsrtDebugManager::CallDebugEventCallbackForBreak
          (JsrtDebugManager *this,JsDiagDebugEvent debugEvent,DynamicObject *eventDataObject,
          ScriptContext *scriptContext)

{
  int iVar1;
  ThreadContext *pTVar2;
  DebugContext *this_00;
  ProbeContainer *this_01;
  DebugManager *this_02;
  DebuggingFlags *this_03;
  byte local_71;
  ScriptContext *local_50;
  ScriptContext *tempScriptContext;
  undefined1 local_38 [8];
  AutoSetDispatchHaltFlag autoSetDispatchHaltFlag;
  ScriptContext *scriptContext_local;
  DynamicObject *eventDataObject_local;
  JsDiagDebugEvent debugEvent_local;
  JsrtDebugManager *this_local;
  
  autoSetDispatchHaltFlag.m_threadContext = (ThreadContext *)scriptContext;
  pTVar2 = Js::ScriptContext::GetThreadContext(scriptContext);
  AutoSetDispatchHaltFlag::AutoSetDispatchHaltFlag
            ((AutoSetDispatchHaltFlag *)local_38,scriptContext,pTVar2);
  CallDebugEventCallback
            (this,debugEvent,eventDataObject,
             (ScriptContext *)autoSetDispatchHaltFlag.m_threadContext,true);
  pTVar2 = Js::ScriptContext::GetThreadContext
                     ((ScriptContext *)autoSetDispatchHaltFlag.m_threadContext);
  local_50 = ThreadContext::GetScriptContextList(pTVar2);
  while( true ) {
    local_71 = 0;
    if (local_50 != (ScriptContext *)0x0) {
      iVar1 = (*(local_50->super_ScriptContextInfo)._vptr_ScriptContextInfo[0x24])();
      local_71 = (byte)iVar1 ^ 0xff;
    }
    if ((local_71 & 1) == 0) break;
    this_00 = Js::ScriptContext::GetDebugContext(local_50);
    this_01 = Js::DebugContext::GetProbeContainer(this_00);
    Js::ProbeContainer::AsyncDeactivate(this_01);
    local_50 = local_50->next;
  }
  pTVar2 = Js::ScriptContext::GetThreadContext
                     ((ScriptContext *)autoSetDispatchHaltFlag.m_threadContext);
  this_02 = ThreadContext::GetDebugManager(pTVar2);
  this_03 = Js::DebugManager::GetDebuggingFlags(this_02);
  DebuggingFlags::SetForceInterpreter(this_03,false);
  AutoSetDispatchHaltFlag::~AutoSetDispatchHaltFlag((AutoSetDispatchHaltFlag *)local_38);
  return;
}

Assistant:

void JsrtDebugManager::CallDebugEventCallbackForBreak(JsDiagDebugEvent debugEvent, Js::DynamicObject* eventDataObject, Js::ScriptContext* scriptContext)
{
    AutoSetDispatchHaltFlag autoSetDispatchHaltFlag(scriptContext, scriptContext->GetThreadContext());

    this->CallDebugEventCallback(debugEvent, eventDataObject, scriptContext, true /*isBreak*/);

    for (Js::ScriptContext *tempScriptContext = scriptContext->GetThreadContext()->GetScriptContextList();
    tempScriptContext != nullptr && !tempScriptContext->IsClosed();
        tempScriptContext = tempScriptContext->next)
    {
        tempScriptContext->GetDebugContext()->GetProbeContainer()->AsyncDeactivate();
    }

    scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetForceInterpreter(false);
}